

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerHLSL::emit_push_constant_block(CompilerHLSL *this,SPIRVariable *var)

{
  SPIRType *pSVar1;
  bool bVar2;
  uint32_t uVar3;
  TypedID<(spirv_cross::Types)1> TVar4;
  CompilerError *this_00;
  mapped_type *pmVar5;
  mapped_type *pmVar6;
  size_t sVar7;
  Decoration *pDVar8;
  TypedID *this_01;
  string *psVar9;
  allocator local_1d1;
  string local_1d0 [36];
  uint32_t local_1ac;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8 [32];
  spirv_cross local_188 [32];
  undefined1 local_168 [8];
  string member_name;
  string local_140 [8];
  string backup_name;
  TypedID<(spirv_cross::Types)1> *member;
  uint local_110;
  uint32_t offset;
  uint i;
  uint constant_index;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8 [32];
  VectorView<spirv_cross::Meta::Decoration> *local_c8;
  Vector<Decoration> *memb;
  undefined1 local_b8 [80];
  spirv_cross local_68 [36];
  uint32_t local_44;
  SPIRType *pSStack_40;
  uint32_t failed_index;
  SPIRType *type;
  RootConstants *layout;
  iterator __end2;
  iterator __begin2;
  vector<spirv_cross::RootConstants,_std::allocator<spirv_cross::RootConstants>_> *__range2;
  SPIRVariable *var_local;
  CompilerHLSL *this_local;
  
  bVar2 = ::std::vector<spirv_cross::RootConstants,_std::allocator<spirv_cross::RootConstants>_>::
          empty(&this->root_constants_layout);
  if (bVar2) {
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x1e])(this,var);
  }
  else {
    __end2 = ::std::vector<spirv_cross::RootConstants,_std::allocator<spirv_cross::RootConstants>_>
             ::begin(&this->root_constants_layout);
    layout = (RootConstants *)
             ::std::vector<spirv_cross::RootConstants,_std::allocator<spirv_cross::RootConstants>_>
             ::end(&this->root_constants_layout);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<spirv_cross::RootConstants_*,_std::vector<spirv_cross::RootConstants,_std::allocator<spirv_cross::RootConstants>_>_>
                                       *)&layout), bVar2) {
      type = (SPIRType *)
             __gnu_cxx::
             __normal_iterator<spirv_cross::RootConstants_*,_std::vector<spirv_cross::RootConstants,_std::allocator<spirv_cross::RootConstants>_>_>
             ::operator*(&__end2);
      uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).field_0xc);
      pSStack_40 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar3);
      local_44 = 0;
      bVar2 = CompilerGLSL::buffer_is_packing_standard
                        (&this->super_CompilerGLSL,pSStack_40,BufferPackingHLSLCbufferPackOffset,
                         &local_44,*(uint32_t *)&(type->super_IVariant)._vptr_IVariant,
                         *(uint32_t *)((long)&(type->super_IVariant)._vptr_IVariant + 4));
      if (!bVar2) {
        memb._7_1_ = 1;
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        uVar3 = TypedID::operator_cast_to_unsigned_int
                          ((TypedID *)&(pSStack_40->super_IVariant).self);
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                  (local_b8 + 0x30,this,(ulong)uVar3,1);
        CompilerGLSL::to_member_name_abi_cxx11_
                  ((CompilerGLSL *)local_b8,(SPIRType *)this,(uint32_t)pSStack_40);
        join<char_const(&)[26],spirv_cross::TypedID<(spirv_cross::Types)0>const&,char_const(&)[9],std::__cxx11::string,char_const(&)[2],char_const(&)[16],unsigned_int&,char_const(&)[9],std::__cxx11::string,char_const(&)[69]>
                  (local_68,(char (*) [26])"Root constant cbuffer ID ",&(var->super_IVariant).self,
                   (char (*) [9])" (name: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_b8 + 0x30),(char (*) [2])0x4dff7a,(char (*) [16])0x4e348b,&local_44,
                   (char (*) [9])" (name: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,
                   (char (*) [69])
                   ") cannot be expressed with either HLSL packing layout or packoffset.");
        CompilerError::CompilerError(this_00,(string *)local_68);
        memb._7_1_ = 0;
        __cxa_throw(this_00,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(pSStack_40->super_IVariant).self);
      Compiler::set_extended_decoration((Compiler *)this,uVar3,SPIRVCrossDecorationExplicitOffset,0)
      ;
      memb._0_4_ = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).self);
      pmVar5 = ::std::
               unordered_map<unsigned_int,_bool,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bool>_>_>
               ::operator[](&(this->super_CompilerGLSL).flattened_structs,(key_type *)&memb);
      *pmVar5 = false;
      ::std::
      unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(&pSStack_40->member_name_cache);
      uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).self);
      CompilerGLSL::add_resource_name(&this->super_CompilerGLSL,uVar3);
      pmVar6 = ::std::
               unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
               ::operator[](&(this->super_CompilerGLSL).super_Compiler.ir.meta,
                            &(pSStack_40->super_IVariant).self);
      local_c8 = &(pmVar6->members).super_VectorView<spirv_cross::Meta::Decoration>;
      uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).self);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])(local_e8,this,(ulong)uVar3);
      to_resource_register_abi_cxx11_
                ((CompilerHLSL *)&i,(HLSLBindingFlagBits)this,'\x01',0x62,
                 (type->super_IVariant).self.id);
      CompilerGLSL::statement<char_const(&)[34],std::__cxx11::string,std::__cxx11::string>
                (&this->super_CompilerGLSL,(char (*) [34])"cbuffer SPIRV_CROSS_RootConstant_",
                 local_e8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i);
      ::std::__cxx11::string::~string((string *)&i);
      ::std::__cxx11::string::~string((string *)local_e8);
      CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
      offset = 0;
      for (local_110 = 0; sVar7 = VectorView<spirv_cross::Meta::Decoration>::size(local_c8),
          local_110 < sVar7; local_110 = local_110 + 1) {
        pDVar8 = VectorView<spirv_cross::Meta::Decoration>::operator[](local_c8,(ulong)local_110);
        if ((*(uint *)&(type->super_IVariant)._vptr_IVariant <= pDVar8->offset) &&
           (pDVar8->offset < *(uint *)((long)&(type->super_IVariant)._vptr_IVariant + 4))) {
          this_01 = (TypedID *)
                    VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::operator[]
                              (&(pSStack_40->member_types).
                                super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>,
                               (ulong)local_110);
          CompilerGLSL::add_member_name(&this->super_CompilerGLSL,pSStack_40,offset);
          TVar4 = TypedID::operator_cast_to_TypedID((TypedID *)&(pSStack_40->super_IVariant).self);
          psVar9 = Compiler::get_member_name_abi_cxx11_((Compiler *)this,(TypeID)TVar4.id,local_110)
          ;
          ::std::__cxx11::string::string(local_140,(string *)psVar9);
          CompilerGLSL::to_member_name_abi_cxx11_
                    ((CompilerGLSL *)local_168,(SPIRType *)this,(uint32_t)pSStack_40);
          uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).self);
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                    (local_1a8,this,(ulong)uVar3,1);
          join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&>
                    (local_188,local_1a8,(char (*) [2])0x4e3b4c,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168)
          ;
          ::std::__cxx11::string::operator=((string *)local_168,(string *)local_188);
          ::std::__cxx11::string::~string((string *)local_188);
          ::std::__cxx11::string::~string((string *)local_1a8);
          ParsedIR::sanitize_underscores((string *)local_168);
          local_1ac = (uint32_t)
                      TypedID::operator_cast_to_TypedID
                                ((TypedID *)&(pSStack_40->super_IVariant).self);
          Compiler::set_member_name((Compiler *)this,(TypeID)local_1ac,offset,(string *)local_168);
          pSVar1 = pSStack_40;
          uVar3 = TypedID::operator_cast_to_unsigned_int(this_01);
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string(local_1d0,"",&local_1d1);
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x15])
                    (this,pSVar1,(ulong)uVar3,(ulong)local_110,local_1d0,
                     (ulong)*(uint *)&(type->super_IVariant)._vptr_IVariant);
          ::std::__cxx11::string::~string(local_1d0);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
          TVar4 = TypedID::operator_cast_to_TypedID((TypedID *)&(pSStack_40->super_IVariant).self);
          Compiler::set_member_name((Compiler *)this,(TypeID)TVar4.id,offset,(string *)local_140);
          offset = offset + 1;
          ::std::__cxx11::string::~string((string *)local_168);
          ::std::__cxx11::string::~string(local_140);
        }
      }
      CompilerGLSL::end_scope_decl(&this->super_CompilerGLSL);
      __gnu_cxx::
      __normal_iterator<spirv_cross::RootConstants_*,_std::vector<spirv_cross::RootConstants,_std::allocator<spirv_cross::RootConstants>_>_>
      ::operator++(&__end2);
    }
  }
  return;
}

Assistant:

void CompilerHLSL::emit_push_constant_block(const SPIRVariable &var)
{
	if (root_constants_layout.empty())
	{
		emit_buffer_block(var);
	}
	else
	{
		for (const auto &layout : root_constants_layout)
		{
			auto &type = get<SPIRType>(var.basetype);

			uint32_t failed_index = 0;
			if (buffer_is_packing_standard(type, BufferPackingHLSLCbufferPackOffset, &failed_index, layout.start,
			                               layout.end))
				set_extended_decoration(type.self, SPIRVCrossDecorationExplicitOffset);
			else
			{
				SPIRV_CROSS_THROW(join("Root constant cbuffer ID ", var.self, " (name: ", to_name(type.self), ")",
				                       ", member index ", failed_index, " (name: ", to_member_name(type, failed_index),
				                       ") cannot be expressed with either HLSL packing layout or packoffset."));
			}

			flattened_structs[var.self] = false;
			type.member_name_cache.clear();
			add_resource_name(var.self);
			auto &memb = ir.meta[type.self].members;

			statement("cbuffer SPIRV_CROSS_RootConstant_", to_name(var.self),
			          to_resource_register(HLSL_BINDING_AUTO_PUSH_CONSTANT_BIT, 'b', layout.binding, layout.space));
			begin_scope();

			// Index of the next field in the generated root constant constant buffer
			auto constant_index = 0u;

			// Iterate over all member of the push constant and check which of the fields
			// fit into the given root constant layout.
			for (auto i = 0u; i < memb.size(); i++)
			{
				const auto offset = memb[i].offset;
				if (layout.start <= offset && offset < layout.end)
				{
					const auto &member = type.member_types[i];

					add_member_name(type, constant_index);
					auto backup_name = get_member_name(type.self, i);
					auto member_name = to_member_name(type, i);
					member_name = join(to_name(var.self), "_", member_name);
					ParsedIR::sanitize_underscores(member_name);
					set_member_name(type.self, constant_index, member_name);
					emit_struct_member(type, member, i, "", layout.start);
					set_member_name(type.self, constant_index, backup_name);

					constant_index++;
				}
			}

			end_scope_decl();
		}
	}
}